

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm_writer.cpp
# Opt level: O0

void __thiscall VM_Writer::write_arithmetic(VM_Writer *this,string *command)

{
  ostream *poVar1;
  string local_38;
  string *local_18;
  string *command_local;
  VM_Writer *this_local;
  
  poVar1 = (ostream *)this->out_file;
  local_18 = command;
  command_local = (string *)this;
  translate_operator(&local_38,this,command);
  poVar1 = std::operator<<(poVar1,(string *)&local_38);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void VM_Writer::write_arithmetic(const std::string &command) {
    out_file << translate_operator(command) <<
    std::endl;
}